

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::operator_cast_to_bool(json *this)

{
  json_exception *this_00;
  char *json_type_name;
  json *this_local;
  
  if (this->m_type == boolean_e) {
    this_local._7_1_ = (bool)((this->m_value).u_boolean & 1);
  }
  else {
    if (this->m_type != number_int_e) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_type_name = get_instance_type_name(this);
      json_exception::json_exception(this_00,not_number_int_or_boolean_e,json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
    }
    this_local._7_1_ = (this->m_value).u_number_int != 0;
  }
  return this_local._7_1_;
}

Assistant:

json::operator bool() const
{
    if (m_type == boolean_e)
    {
        return m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        return m_value.u_number_int != 0;
    }
    else
    {
        throw json_exception(json_exception::not_number_int_or_boolean_e, get_instance_type_name());
    }
}